

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O3

void __thiscall
duckdb::IEJoinGlobalSourceState::GetNextPair
          (IEJoinGlobalSourceState *this,ClientContext *client,IEJoinLocalSourceState *lstate)

{
  atomic<unsigned_long> *paVar1;
  vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
  *this_00;
  PhysicalIEJoin *op;
  value_type vVar2;
  reference pvVar3;
  type t1;
  type t2;
  const_reference pvVar4;
  pointer pSVar5;
  ulong __n;
  reference pvVar6;
  IEJoinUnion *this_01;
  reference this_02;
  pointer pRVar7;
  ulong uVar8;
  ulong uVar9;
  vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
  *this_03;
  long lVar10;
  
  lVar10 = 0;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::operator[](&this->gsink->tables,0);
  t1 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
       ::operator*(pvVar3);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::operator[](&this->gsink->tables,1);
  t2 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
       ::operator*(pvVar3);
  this_00 = &(t1->global_sort_state).sorted_blocks;
  if ((t1->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (t1->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
             ::operator[](this_00,0);
    pSVar5 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator->(pvVar4);
    lVar10 = (long)(pSVar5->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar5->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  this_03 = &(t2->global_sort_state).sorted_blocks;
  if ((t2->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (t2->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = 0;
  }
  else {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
             ::operator[](this_03,0);
    pSVar5 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator->(pvVar4);
    uVar8 = (long)(pSVar5->radix_sorting_data).
                  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pSVar5->radix_sorting_data).
                  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  LOCK();
  paVar1 = &this->next_pair;
  uVar9 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if (lVar10 * uVar8 <= uVar9) {
    if (((this->left_outers).super___atomic_base<unsigned_long>._M_i != 0) ||
       ((this->right_outers).super___atomic_base<unsigned_long>._M_i != 0)) {
      while ((this->completed).super___atomic_base<unsigned_long>._M_i < lVar10 * uVar8) {
        sched_yield();
      }
      LOCK();
      paVar1 = &this->next_left;
      uVar8 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      if (uVar8 < (this->left_outers).super___atomic_base<unsigned_long>._M_i) {
        ::std::__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>::
        reset((__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)
              &lstate->joiner,(pointer)0x0);
        lstate->left_block_index = uVar8;
        pvVar6 = vector<unsigned_long,_true>::operator[](&this->left_bases,uVar8);
        vVar2 = *pvVar6;
        lstate->left_base = vVar2;
        lstate->left_matches =
             (t1->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
             super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
             super__Head_base<0UL,_bool_*,_false>._M_head_impl + vVar2;
        lstate->outer_idx = 0;
        pvVar4 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
                 ::operator[](this_00,0);
        pSVar5 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
                 operator->(pvVar4);
      }
      else {
        lstate->left_matches = (bool *)0x0;
        LOCK();
        paVar1 = &this->next_right;
        uVar8 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
        if ((this->right_outers).super___atomic_base<unsigned_long>._M_i <= uVar8) {
          lstate->right_matches = (bool *)0x0;
          return;
        }
        ::std::__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>::
        reset((__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)
              &lstate->joiner,(pointer)0x0);
        lstate->right_block_index = uVar8;
        pvVar6 = vector<unsigned_long,_true>::operator[](&this->right_bases,uVar8);
        vVar2 = *pvVar6;
        lstate->right_base = vVar2;
        lstate->right_matches =
             (t2->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
             super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
             super__Head_base<0UL,_bool_*,_false>._M_head_impl + vVar2;
        lstate->outer_idx = 0;
        pvVar4 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
                 ::operator[](this_03,0);
        pSVar5 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
                 operator->(pvVar4);
      }
      this_02 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                ::operator[](&pSVar5->radix_sorting_data,uVar8);
      pRVar7 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(this_02);
      lstate->outer_count = pRVar7->count;
    }
    return;
  }
  __n = uVar9 / uVar8;
  uVar9 = uVar9 % uVar8;
  lstate->left_block_index = __n;
  pvVar6 = vector<unsigned_long,_true>::operator[](&this->left_bases,__n);
  lstate->left_base = *pvVar6;
  lstate->right_block_index = uVar9;
  pvVar6 = vector<unsigned_long,_true>::operator[](&this->right_bases,uVar9);
  lstate->right_base = *pvVar6;
  op = this->op;
  this_01 = (IEJoinUnion *)operator_new(0xf8);
  IEJoinUnion::IEJoinUnion(this_01,client,op,t1,__n,t2,uVar9);
  ::std::__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>::reset
            ((__uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_> *)
             &lstate->joiner,this_01);
  return;
}

Assistant:

void GetNextPair(ClientContext &client, IEJoinLocalSourceState &lstate) {
		auto &left_table = *gsink.tables[0];
		auto &right_table = *gsink.tables[1];

		const auto left_blocks = left_table.BlockCount();
		const auto right_blocks = right_table.BlockCount();
		const auto pair_count = left_blocks * right_blocks;

		// Regular block
		const auto i = next_pair++;
		if (i < pair_count) {
			const auto b1 = i / right_blocks;
			const auto b2 = i % right_blocks;

			lstate.left_block_index = b1;
			lstate.left_base = left_bases[b1];

			lstate.right_block_index = b2;
			lstate.right_base = right_bases[b2];

			lstate.joiner = make_uniq<IEJoinUnion>(client, op, left_table, b1, right_table, b2);
			return;
		}

		// Outer joins
		if (!left_outers && !right_outers) {
			return;
		}

		// Spin wait for regular blocks to finish(!)
		while (completed < pair_count) {
			std::this_thread::yield();
		}

		// Left outer blocks
		const auto l = next_left++;
		if (l < left_outers) {
			lstate.joiner = nullptr;
			lstate.left_block_index = l;
			lstate.left_base = left_bases[l];

			lstate.left_matches = left_table.found_match.get() + lstate.left_base;
			lstate.outer_idx = 0;
			lstate.outer_count = left_table.BlockSize(l);
			return;
		} else {
			lstate.left_matches = nullptr;
		}

		// Right outer block
		const auto r = next_right++;
		if (r < right_outers) {
			lstate.joiner = nullptr;
			lstate.right_block_index = r;
			lstate.right_base = right_bases[r];

			lstate.right_matches = right_table.found_match.get() + lstate.right_base;
			lstate.outer_idx = 0;
			lstate.outer_count = right_table.BlockSize(r);
			return;
		} else {
			lstate.right_matches = nullptr;
		}
	}